

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O3

bool __thiscall QFSFileEnginePrivate::openFh(QFSFileEnginePrivate *this,OpenMode openMode,FILE *fh)

{
  QAbstractFileEngine *this_00;
  int iVar1;
  int *piVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
  this->fh = fh;
  this->fd = -1;
  bVar3 = true;
  if (((uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
             super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 4) != 0) {
    do {
      iVar1 = fseeko64((FILE *)fh,0,2);
      if (iVar1 == 0) goto LAB_00148cb6;
      piVar2 = __errno_location();
      iVar1 = *piVar2;
    } while (iVar1 == 4);
    QSystemError::stdString(&local_40,iVar1);
    QAbstractFileEngine::setError(this_00,iVar1 == 0x18 ^ OpenError,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    (this->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
    super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = 0;
    this->fh = (FILE *)0x0;
    bVar3 = false;
  }
LAB_00148cb6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QFSFileEnginePrivate::openFh(QIODevice::OpenMode openMode, FILE *fh)
{
    Q_ASSERT_X(openMode & QIODevice::Unbuffered, "QFSFileEngine::open",
               "QFSFileEngine no longer supports buffered mode; upper layer must buffer");

    Q_Q(QFSFileEngine);
    this->fh = fh;
    fd = -1;

    // Seek to the end when in Append mode.
    if (openMode & QIODevice::Append) {
        int ret;
        do {
            ret = QT_FSEEK(fh, 0, SEEK_END);
        } while (ret != 0 && errno == EINTR);

        if (ret != 0) {
            q->setError(errno == EMFILE ? QFile::ResourceError : QFile::OpenError,
                        QSystemError::stdString(errno));

            this->openMode = QIODevice::NotOpen;
            this->fh = nullptr;

            return false;
        }
    }

    return true;
}